

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O1

void PrintExtraInfoLossy(WebPPicture *pic,int short_output,int full_details,char *file_name)

{
  uint uVar1;
  uint uVar2;
  WebPAuxStats *stats;
  int iVar3;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  float fVar7;
  int totals [4];
  
  stats = pic->stats;
  if (short_output == 0) {
    uVar6 = stats->block_count[0];
    uVar1 = stats->block_count[1];
    uVar2 = stats->block_count[2];
    fprintf(stderr,"File:      %s\n",file_name);
    pcVar4 = " (with alpha)";
    if (stats->alpha_data_size == 0) {
      pcVar4 = "";
    }
    fprintf(stderr,"Dimension: %d x %d%s\n",(ulong)(uint)pic->width,(ulong)(uint)pic->height,pcVar4)
    ;
    fprintf(stderr,
            "Output:    %d bytes Y-U-V-All-PSNR %2.2f %2.2f %2.2f   %2.2f dB\n           (%.2f bpp)\n"
            ,SUB84((double)stats->PSNR[0],0),(double)stats->PSNR[1],(double)stats->PSNR[2],
            (double)stats->PSNR[3],
            (double)((((float)stats->coded_size * 8.0) / (float)pic->width) / (float)pic->height));
    iVar3 = uVar1 + uVar6;
    if (iVar3 != 0 && SCARRY4(uVar1,uVar6) == iVar3 < 0) {
      fVar7 = (float)iVar3;
      fprintf(stderr,
              "block count:  intra4:     %6d  (%.2f%%)\n              intra16:    %6d  (%.2f%%)\n              skipped:    %6d  (%.2f%%)\n"
              ,SUB84((double)(((float)(int)uVar6 * 100.0) / fVar7),0),
              (double)(((float)(int)uVar1 * 100.0) / fVar7),
              (double)(((float)(int)uVar2 * 100.0) / fVar7),(ulong)uVar6,(ulong)uVar1,(ulong)uVar2);
      fprintf(stderr,
              "bytes used:  header:         %6d  (%.1f%%)\n             mode-partition: %6d  (%.1f%%)\n"
              ,SUB84((double)(((float)stats->header_bytes[0] * 100.0) / (float)stats->coded_size),0)
              ,(double)(((float)stats->header_bytes[1] * 100.0) / (float)stats->coded_size));
      if (0 < stats->alpha_data_size) {
        fprintf(stderr,"             transparency:   %6d (%.1f dB)\n",
                SUB84((double)stats->PSNR[4],0));
      }
      fwrite(" Residuals bytes  |segment 1|segment 2|segment 3|segment 4|  total\n",0x43,1,stderr);
      if (full_details != 0) {
        PrintExtraInfoLossy_cold_2();
      }
      fwrite("    macroblocks:  ",0x12,1,stderr);
      uVar6 = stats->segment_size[1] + stats->segment_size[0] + stats->segment_size[2] +
              stats->segment_size[3];
      lVar5 = 0x17;
      do {
        fprintf(stderr,"|     %3d%%",
                (ulong)(uint)(int)(((double)(int)stats->PSNR[lVar5 + -1] * 100.0) /
                                   (double)(int)uVar6 + 0.5));
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x1b);
      fprintf(stderr,"| %7d\n",(ulong)uVar6);
      fwrite("      quantizer:  ",0x12,1,stderr);
      PrintValues(stats->segment_quant);
      fwrite("   filter level:  ",0x12,1,stderr);
      PrintValues(stats->segment_level);
      if (full_details != 0) {
        PrintExtraInfoLossy_cold_3();
      }
    }
    if (0 < stats->lossless_size) {
      PrintFullLosslessInfo(stats,"alpha");
    }
  }
  else {
    PrintExtraInfoLossy_cold_1();
  }
  return;
}

Assistant:

static void PrintExtraInfoLossy(const WebPPicture* const pic, int short_output,
                                int full_details,
                                const char* const file_name) {
  const WebPAuxStats* const stats = pic->stats;
  if (short_output) {
    fprintf(stderr, "%7d %2.2f\n", stats->coded_size, stats->PSNR[3]);
  } else {
    const int num_i4 = stats->block_count[0];
    const int num_i16 = stats->block_count[1];
    const int num_skip = stats->block_count[2];
    const int total = num_i4 + num_i16;
    WFPRINTF(stderr, "File:      %s\n", (const W_CHAR*)file_name);
    fprintf(stderr, "Dimension: %d x %d%s\n",
            pic->width, pic->height,
            stats->alpha_data_size ? " (with alpha)" : "");
    fprintf(stderr, "Output:    "
            "%d bytes Y-U-V-All-PSNR %2.2f %2.2f %2.2f   %2.2f dB\n"
            "           (%.2f bpp)\n",
            stats->coded_size,
            stats->PSNR[0], stats->PSNR[1], stats->PSNR[2], stats->PSNR[3],
            8.f * stats->coded_size / pic->width / pic->height);
    if (total > 0) {
      int totals[4] = { 0, 0, 0, 0 };
      fprintf(stderr, "block count:  intra4:     %6d  (%.2f%%)\n"
                      "              intra16:    %6d  (%.2f%%)\n"
                      "              skipped:    %6d  (%.2f%%)\n",
              num_i4, 100.f * num_i4 / total,
              num_i16, 100.f * num_i16 / total,
              num_skip, 100.f * num_skip / total);
      fprintf(stderr, "bytes used:  header:         %6d  (%.1f%%)\n"
                      "             mode-partition: %6d  (%.1f%%)\n",
              stats->header_bytes[0],
              100.f * stats->header_bytes[0] / stats->coded_size,
              stats->header_bytes[1],
              100.f * stats->header_bytes[1] / stats->coded_size);
      if (stats->alpha_data_size > 0) {
        fprintf(stderr, "             transparency:   %6d (%.1f dB)\n",
                stats->alpha_data_size, stats->PSNR[4]);
      }
      fprintf(stderr, " Residuals bytes  "
                      "|segment 1|segment 2|segment 3"
                      "|segment 4|  total\n");
      if (full_details) {
        fprintf(stderr, "  intra4-coeffs:  ");
        PrintByteCount(stats->residual_bytes[0], stats->coded_size, totals);
        fprintf(stderr, " intra16-coeffs:  ");
        PrintByteCount(stats->residual_bytes[1], stats->coded_size, totals);
        fprintf(stderr, "  chroma coeffs:  ");
        PrintByteCount(stats->residual_bytes[2], stats->coded_size, totals);
      }
      fprintf(stderr, "    macroblocks:  ");
      PrintPercents(stats->segment_size);
      fprintf(stderr, "      quantizer:  ");
      PrintValues(stats->segment_quant);
      fprintf(stderr, "   filter level:  ");
      PrintValues(stats->segment_level);
      if (full_details) {
        fprintf(stderr, "------------------+---------");
        fprintf(stderr, "+---------+---------+---------+-----------------\n");
        fprintf(stderr, " segments total:  ");
        PrintByteCount(totals, stats->coded_size, NULL);
      }
    }
    if (stats->lossless_size > 0) {
      PrintFullLosslessInfo(stats, "alpha");
    }
  }
}